

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.cpp
# Opt level: O0

void __thiscall EOServer::~EOServer(EOServer *this)

{
  EOClient *this_00;
  World *this_01;
  bool bVar1;
  list<Client_*,_std::allocator<Client_*>_> *plVar2;
  reference ppCVar3;
  size_type sVar4;
  double dVar5;
  double dVar6;
  Client *client_1;
  iterator __end1_1;
  iterator __begin1_1;
  list<Client_*,_std::allocator<Client_*>_> *__range1_1;
  EOClient *eoclient;
  Client *client;
  iterator __end1;
  iterator __begin1;
  list<Client_*,_std::allocator<Client_*>_> *__range1;
  PacketBuilder builder;
  double shutdown_start_time;
  EOServer *this_local;
  
  (this->super_Server)._vptr_Server = (_func_int **)&PTR_ClientFactory_002c5810;
  builder.add_size = (size_t)Timer::GetTime();
  PacketBuilder::PacketBuilder((PacketBuilder *)&__range1,PACKET_MESSAGE,PACKET_CLOSE,0);
  PacketBuilder::AddByte((PacketBuilder *)&__range1,'r');
  plVar2 = &(this->super_Server).clients;
  __end1 = std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::begin(plVar2);
  client = (Client *)std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::end(plVar2);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&client), bVar1) {
    ppCVar3 = std::_List_iterator<Client_*>::operator*(&__end1);
    this_00 = (EOClient *)*ppCVar3;
    EOClient::Send(this_00,(PacketBuilder *)&__range1);
    Client::FinishWriting((Client *)this_00);
    std::_List_iterator<Client_*>::operator++(&__end1);
  }
  while (dVar5 = (double)builder.add_size + 1.0, dVar6 = Timer::GetTime(), dVar5 < dVar6) {
    Server::Select(&this->super_Server,0.1);
  }
  plVar2 = &(this->super_Server).clients;
  __end1_1 = std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::begin(plVar2);
  client_1 = (Client *)std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::end(plVar2);
  while (bVar1 = std::operator!=(&__end1_1,(_Self *)&client_1), bVar1) {
    ppCVar3 = std::_List_iterator<Client_*>::operator*(&__end1_1);
    Client::Close(*ppCVar3,false);
    std::_List_iterator<Client_*>::operator++(&__end1_1);
  }
  while (sVar4 = std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::size
                           (&(this->super_Server).clients), sVar4 != 0) {
    Server::Select(&this->super_Server,0.1);
    Server::BuryTheDead(&this->super_Server);
  }
  this_01 = this->world;
  if (this_01 != (World *)0x0) {
    World::~World(this_01);
    operator_delete(this_01,0x980);
  }
  PacketBuilder::~PacketBuilder((PacketBuilder *)&__range1);
  std::
  unordered_map<IPAddress,_ConnectionLogEntry,_std::hash<IPAddress>,_std::equal_to<IPAddress>,_std::allocator<std::pair<const_IPAddress,_ConnectionLogEntry>_>_>
  ::~unordered_map(&this->connection_log);
  Server::~Server(&this->super_Server);
  return;
}

Assistant:

EOServer::~EOServer()
{
	double shutdown_start_time = Timer::GetTime();

	PacketBuilder builder(PACKET_MESSAGE, PACKET_CLOSE);
	builder.AddByte('r');

	// Send server reboot message
	for (Client* client : this->clients)
	{
		EOClient* eoclient = static_cast<EOClient*>(client);
		eoclient->Send(builder);
		eoclient->FinishWriting();
	}

	// Spend up to 1 second pumping the clients' send buffers dry
	while (shutdown_start_time + 1.0 < Timer::GetTime())
	{
		this->Select(0.1);
	}

	// All clients must be fully closed before the world ends
	UTIL_FOREACH(this->clients, client)
	{
		client->Close();
	}

	// Spend up to 2 seconds shutting down
	while (this->clients.size() > 0)
	{
		this->Select(0.1);
		this->BuryTheDead();
	}

	delete this->world;
}